

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostinfo.c
# Opt level: O3

void * lookup_thread_main(void *_unused)

{
  st_h2o_linklist_t *psVar1;
  st_h2o_linklist_t *psVar2;
  size_t sVar3;
  int __ecode;
  st_h2o_linklist_t *psVar4;
  addrinfo *paVar5;
  addrinfo *res;
  addrinfo *local_30;
  
  pthread_mutex_lock((pthread_mutex_t *)&queue);
  do {
    sVar3 = queue.num_threads_idle - 1;
    if (queue.pending.next != &queue.pending) {
      do {
        queue.num_threads_idle = sVar3;
        psVar2 = queue.pending.next;
        psVar4 = (queue.pending.next)->next;
        psVar1 = (queue.pending.next)->prev;
        psVar4->prev = psVar1;
        psVar1->next = psVar4;
        psVar2->next = (st_h2o_linklist_t *)0x0;
        psVar2->prev = (st_h2o_linklist_t *)0x0;
        pthread_mutex_unlock((pthread_mutex_t *)&queue);
        __ecode = getaddrinfo((char *)psVar2[1].next,(char *)psVar2[1].prev,(addrinfo *)(psVar2 + 2)
                              ,&local_30);
        psVar2[1].next = (st_h2o_linklist_t *)0x0;
        psVar2[1].prev = (st_h2o_linklist_t *)0x0;
        if (__ecode == 0) {
          psVar4 = (st_h2o_linklist_t *)0x0;
          paVar5 = local_30;
        }
        else {
          psVar4 = (st_h2o_linklist_t *)gai_strerror(__ecode);
          paVar5 = (addrinfo *)0x0;
        }
        psVar2[2].next = psVar4;
        psVar2[2].prev = (st_h2o_linklist_t *)paVar5;
        h2o_multithread_send_message
                  ((h2o_multithread_receiver_t *)psVar2[-2].prev,
                   (h2o_multithread_message_t *)(psVar2 + 1));
        pthread_mutex_lock((pthread_mutex_t *)&queue);
        sVar3 = queue.num_threads_idle;
      } while (queue.pending.next != &queue.pending);
      queue.num_threads_idle = queue.num_threads_idle + 1;
    }
    pthread_cond_wait((pthread_cond_t *)&queue.cond,(pthread_mutex_t *)&queue);
  } while( true );
}

Assistant:

static void *lookup_thread_main(void *_unused)
{
    pthread_mutex_lock(&queue.mutex);

    while (1) {
        --queue.num_threads_idle;
        while (!h2o_linklist_is_empty(&queue.pending)) {
            h2o_hostinfo_getaddr_req_t *req = H2O_STRUCT_FROM_MEMBER(h2o_hostinfo_getaddr_req_t, _pending, queue.pending.next);
            h2o_linklist_unlink(&req->_pending);
            pthread_mutex_unlock(&queue.mutex);
            lookup_and_respond(req);
            pthread_mutex_lock(&queue.mutex);
        }
        ++queue.num_threads_idle;
        pthread_cond_wait(&queue.cond, &queue.mutex);
    }

    h2o_fatal("unreachable");
    return NULL;
}